

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

string * __thiscall
iDynTree::Model::getFrameName_abi_cxx11_
          (string *__return_storage_ptr__,Model *this,FrameIndex frameIndex)

{
  long lVar1;
  size_t sVar2;
  ostream *poVar3;
  pointer pbVar4;
  char *local_1c8 [4];
  stringstream ss;
  ostream local_198 [376];
  
  if (frameIndex < 0) {
    lVar1 = ((long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x70;
LAB_001af53d:
    if (lVar1 <= frameIndex) {
      sVar2 = getNrOfFrames(this);
      if (frameIndex < (long)sVar2) {
        pbVar4 = (this->frameNames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (frameIndex - lVar1);
        goto LAB_001af563;
      }
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar3 = std::operator<<(local_198,"frameIndex ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," is not valid, should be between 0 and ");
    getNrOfFrames(this);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("Model","getFrameName",local_1c8[0]);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)FRAME_INVALID_NAME_abi_cxx11_);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  else {
    lVar1 = ((long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x70;
    if (lVar1 <= frameIndex) goto LAB_001af53d;
    pbVar4 = (this->linkNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frameIndex;
LAB_001af563:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Model::getFrameName(const FrameIndex frameIndex) const
{
    if( frameIndex >= 0 && frameIndex < (FrameIndex)this->getNrOfLinks() )
    {
        return linkNames[frameIndex];
    }
    else if( frameIndex >= (FrameIndex)this->getNrOfLinks() && frameIndex < (FrameIndex)this->getNrOfFrames() )
    {
        return frameNames[frameIndex-getNrOfLinks()];
    }
    else
    {
        std::stringstream ss;
        ss << "frameIndex " << frameIndex << " is not valid, should be between 0 and " << this->getNrOfFrames()-1;
        reportError("Model","getFrameName",ss.str().c_str());
        return FRAME_INVALID_NAME;
    }
}